

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool OrderEdgesAroundOpenVertex(ON_Brep *B,int vid,ON_2dex *trim_ends)

{
  int iVar1;
  ON_BrepVertex *pOVar2;
  int *piVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepTrim *pOVar5;
  ON_2dex *pOVar6;
  ON_2dex *pOVar7;
  ON_BrepTrim *pOVar8;
  int local_e0;
  int local_dc;
  int local_d0;
  ON_BrepTrim *NTi;
  ON_2dex *nte;
  ON_2dex *end_te;
  ON_BrepEdge *pNE;
  ON_BrepTrim *NT;
  int next_ti;
  ON_2dex *lte;
  int count;
  ON_2dex *start_te;
  ON_BrepTrim *StartT;
  bool bAtStart;
  ON_BrepEdge *StartE;
  ON_BrepEdge *E;
  int local_38;
  int end;
  int start;
  int i;
  ON_BrepVertex *V;
  ON_2dex *trim_ends_local;
  int vid_local;
  ON_Brep *B_local;
  
  if (((-1 < vid) &&
      (pOVar2 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&B->m_V,vid), -1 < pOVar2->m_vertex_index
      )) && (iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ei), 1 < iVar1)) {
    local_38 = -1;
    E._4_4_ = -1;
    for (end = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ei), end < iVar1; end = end + 1) {
      piVar3 = ON_SimpleArray<int>::operator[](&pOVar2->m_ei,end);
      pOVar4 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&B->m_E,*piVar3)
      ;
      if (pOVar4->m_edge_index < 0) {
        return false;
      }
      iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
      if (iVar1 == 1) {
        if (local_38 < 0) {
          local_38 = end;
        }
        else {
          if (-1 < E._4_4_) {
            return false;
          }
          E._4_4_ = end;
        }
      }
    }
    if ((-1 < local_38) && (-1 < E._4_4_)) {
      piVar3 = ON_SimpleArray<int>::operator[](&pOVar2->m_ei,local_38);
      pOVar4 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&B->m_E,*piVar3)
      ;
      iVar1 = pOVar4->m_vi[0];
      piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
      pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&B->m_T,*piVar3)
      ;
      piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
      trim_ends->i = *piVar3;
      trim_ends->j = (uint)((iVar1 == vid) == (bool)(pOVar5->m_bRev3d & 1U));
      lte._4_4_ = 0;
      while (iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ei), lte._4_4_ < iVar1) {
        pOVar6 = trim_ends + lte._4_4_;
        lte._4_4_ = lte._4_4_ + 1;
        if (pOVar6->j == 0) {
          local_d0 = ON_Brep::PrevNonsingularTrim(B,pOVar6->i);
        }
        else {
          local_d0 = ON_Brep::NextNonsingularTrim(B,pOVar6->i);
        }
        if (local_d0 < 0) {
          return false;
        }
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,local_d0);
        pOVar4 = ON_BrepTrim::Edge(pOVar5);
        if (pOVar4 == (ON_BrepEdge *)0x0) {
          return false;
        }
        iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
        if (2 < iVar1) {
          return false;
        }
        iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
        if (iVar1 == 1) {
          iVar1 = pOVar5->m_ei;
          piVar3 = ON_SimpleArray<int>::operator[](&pOVar2->m_ei,E._4_4_);
          if (iVar1 != *piVar3) {
            return false;
          }
          iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_ei);
          if (lte._4_4_ == iVar1 + -1) {
            trim_ends[lte._4_4_].i = local_d0;
            trim_ends[lte._4_4_].j = 1 - pOVar6->j;
            return true;
          }
          return false;
        }
        pOVar7 = trim_ends + lte._4_4_;
        piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
        if (*piVar3 == local_d0) {
          piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,1);
          local_dc = *piVar3;
        }
        else {
          piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
          local_dc = *piVar3;
        }
        pOVar7->i = local_dc;
        pOVar8 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&B->m_T,pOVar7->i);
        if ((pOVar8->m_bRev3d & 1U) == (pOVar5->m_bRev3d & 1U)) {
          local_e0 = 1 - pOVar6->j;
        }
        else {
          local_e0 = pOVar6->j;
        }
        pOVar7->j = local_e0;
      }
    }
  }
  return false;
}

Assistant:

bool OrderEdgesAroundOpenVertex(const ON_Brep& B, int vid, ON_2dex* trim_ends)

{
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  if (V.m_ei.Count() < 2)
    return false;
  int i;
  int start = -1;
  int end = -1;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_edge_index < 0)
      return false;
    if (E.m_ti.Count() == 1){
      if (start < 0)
        start = i;
      else if (end < 0)
        end = i;
      else
        return false;
    }
  }
  if (start < 0 || end < 0)
    return false;
  const ON_BrepEdge& StartE = B.m_E[V.m_ei[start]];
  bool bAtStart = (StartE.m_vi[0] == vid) ? true : false;
  const ON_BrepTrim& StartT = B.m_T[StartE.m_ti[0]];
  ON_2dex& start_te = trim_ends[0];
  start_te.i = StartE.m_ti[0];
  start_te.j = (bAtStart == StartT.m_bRev3d) ? 1 : 0;
  int count = 0;
  while (count < V.m_ei.Count()){
    const ON_2dex& lte = trim_ends[count];
    count++;
    int next_ti =  (lte.j) ? B.NextNonsingularTrim(lte.i) : B.PrevNonsingularTrim(lte.i);
   if (next_ti<0)
     return false;
   const ON_BrepTrim& NT = B.m_T[next_ti];
   const ON_BrepEdge* pNE = NT.Edge();
   if (!pNE)
     return false;
   if (pNE->m_ti.Count() > 2)
     return false;
   if (pNE->m_ti.Count() == 1){
     if (NT.m_ei == V.m_ei[end]){
       if (count != V.m_ei.Count()-1)
         return false;
       ON_2dex& end_te = trim_ends[count];
       end_te.i = next_ti;
       end_te.j = 1-lte.j;
       return true;
     }
     return false;
   }
   ON_2dex& nte = trim_ends[count];
   nte.i = (pNE->m_ti[0] == next_ti) ? pNE->m_ti[1] : pNE->m_ti[0];
   const ON_BrepTrim& NTi = B.m_T[nte.i];
   nte.j = (NTi.m_bRev3d == NT.m_bRev3d) ? 1-lte.j : lte.j;
  }
  return false;
}